

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O1

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> *
detail::operator|(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *__return_storage_ptr__,b_str<char> *str,
                 split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  long *local_48 [2];
  long local_38 [2];
  
  uVar5 = std::__cxx11::string::find_last_of
                    ((char *)str,(ulong)(info->delim)._M_dataplus._M_p,0xffffffffffffffff);
  if (uVar5 == 0xffffffffffffffff) {
    __return_storage_ptr__->_M_elems[0]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[0].field_2;
    __return_storage_ptr__->_M_elems[0]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[0].field_2._M_local_buf[0] = '\0';
    paVar1 = &__return_storage_ptr__->_M_elems[1].field_2;
    __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p = (pointer)paVar1;
    pcVar3 = (str->_M_dataplus)._M_p;
    paVar2 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar2) {
      uVar4 = *(undefined8 *)((long)&str->field_2 + 8);
      paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->_M_elems[1].field_2 + 8) = uVar4;
    }
    else {
      __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p = pcVar3;
      __return_storage_ptr__->_M_elems[1].field_2._M_allocated_capacity =
           paVar2->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_elems[1]._M_string_length = str->_M_string_length;
    (str->_M_dataplus)._M_p = (pointer)paVar2;
    str->_M_string_length = 0;
    (str->field_2)._M_local_buf[0] = '\0';
  }
  else {
    lVar6 = 0x10;
    do {
      *(long *)((long)__return_storage_ptr__->_M_elems + lVar6 + -0x10) =
           (long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar6;
      *(undefined8 *)((long)__return_storage_ptr__->_M_elems + lVar6 + -8) = 0;
      *(undefined1 *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar6) = 0;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x50);
    std::__cxx11::string::substr((ulong)local_48,(ulong)str);
    std::__cxx11::string::operator=
              ((string *)(__return_storage_ptr__->_M_elems + 1),(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    lVar6 = std::__cxx11::string::find_last_not_of
                      ((char *)str,(ulong)(info->delim)._M_dataplus._M_p,uVar5);
    uVar5 = lVar6 + 1;
    if (str->_M_string_length < uVar5) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar5);
    }
    str->_M_string_length = uVar5;
    (str->_M_dataplus)._M_p[uVar5] = '\0';
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_last, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_last_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { {}, std::move(str) } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(pos + 1);
		str.erase(str.find_last_not_of(info.delim, pos) + 1);
		re[0] = std::move(str);
		return re;
	}